

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

void __thiscall icu_63::NFRule::_appendRuleText(NFRule *this,UnicodeString *result)

{
  short sVar1;
  int16_t iVar2;
  char16_t cVar3;
  ERuleType EVar4;
  int32_t iVar5;
  UnicodeString *pUVar6;
  char16_t local_112;
  char16_t local_102;
  char16_t local_f2;
  undefined1 local_c8 [8];
  UnicodeString temp;
  UnicodeString ruleTextCopy;
  int i;
  int numCarets;
  ConstChar16Ptr local_38 [3];
  ConstChar16Ptr local_20;
  UnicodeString *local_18;
  UnicodeString *result_local;
  NFRule *this_local;
  
  local_18 = result;
  result_local = (UnicodeString *)this;
  EVar4 = getType(this);
  pUVar6 = local_18;
  switch(EVar4) {
  case kNaNRule:
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&i,L"NaN");
    UnicodeString::append(pUVar6,(ConstChar16Ptr *)&i,3);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&i);
    break;
  case kInfinityRule:
    ConstChar16Ptr::ConstChar16Ptr(local_38,L"Inf");
    UnicodeString::append(pUVar6,local_38,3);
    ConstChar16Ptr::~ConstChar16Ptr(local_38);
    break;
  case kMasterRule:
    pUVar6 = UnicodeString::append(local_18,L'x');
    if (this->decimalPoint == L'\0') {
      local_112 = L'.';
    }
    else {
      local_112 = this->decimalPoint;
    }
    pUVar6 = UnicodeString::append(pUVar6,local_112);
    UnicodeString::append(pUVar6,L'0');
    break;
  case kProperFractionRule:
    pUVar6 = UnicodeString::append(local_18,L'0');
    if (this->decimalPoint == L'\0') {
      local_102 = L'.';
    }
    else {
      local_102 = this->decimalPoint;
    }
    pUVar6 = UnicodeString::append(pUVar6,local_102);
    UnicodeString::append(pUVar6,L'x');
    break;
  case kImproperFractionRule:
    pUVar6 = UnicodeString::append(local_18,L'x');
    if (this->decimalPoint == L'\0') {
      local_f2 = L'.';
    }
    else {
      local_f2 = this->decimalPoint;
    }
    pUVar6 = UnicodeString::append(pUVar6,local_f2);
    UnicodeString::append(pUVar6,L'x');
    break;
  case kNegativeNumberRule:
    ConstChar16Ptr::ConstChar16Ptr(&local_20,L"-x");
    UnicodeString::append(pUVar6,&local_20,2);
    ConstChar16Ptr::~ConstChar16Ptr(&local_20);
    break;
  default:
    util_append64(local_18,this->baseValue);
    if (this->radix != 10) {
      UnicodeString::append(local_18,L'/');
      util_append64(local_18,(long)this->radix);
    }
    iVar2 = expectedExponent(this);
    sVar1 = this->exponent;
    for (ruleTextCopy.fUnion._48_4_ = 0; (int)ruleTextCopy.fUnion._48_4_ < (int)iVar2 - (int)sVar1;
        ruleTextCopy.fUnion._48_4_ = ruleTextCopy.fUnion._48_4_ + 1) {
      UnicodeString::append(local_18,L'>');
    }
  }
  UnicodeString::append(local_18,L':');
  UnicodeString::append(local_18,L' ');
  cVar3 = UnicodeString::charAt(&this->fRuleText,0);
  if ((cVar3 == L' ') &&
     ((this->sub1 == (NFSubstitution *)0x0 ||
      (iVar5 = NFSubstitution::getPos(this->sub1), iVar5 != 0)))) {
    UnicodeString::append(local_18,L'\'');
  }
  pUVar6 = (UnicodeString *)((long)&temp.fUnion + 0x30);
  UnicodeString::UnicodeString(pUVar6);
  UnicodeString::setTo(pUVar6,&this->fRuleText);
  UnicodeString::UnicodeString((UnicodeString *)local_c8);
  if (this->sub2 != (NFSubstitution *)0x0) {
    (*(this->sub2->super_UObject)._vptr_UObject[5])(this->sub2,local_c8);
    iVar5 = NFSubstitution::getPos(this->sub2);
    UnicodeString::insert
              ((UnicodeString *)((long)&temp.fUnion + 0x30),iVar5,(UnicodeString *)local_c8);
  }
  if (this->sub1 != (NFSubstitution *)0x0) {
    (*(this->sub1->super_UObject)._vptr_UObject[5])(this->sub1,local_c8);
    iVar5 = NFSubstitution::getPos(this->sub1);
    UnicodeString::insert
              ((UnicodeString *)((long)&temp.fUnion + 0x30),iVar5,(UnicodeString *)local_c8);
  }
  UnicodeString::append(local_18,(UnicodeString *)((long)&temp.fUnion + 0x30));
  UnicodeString::append(local_18,L';');
  UnicodeString::~UnicodeString((UnicodeString *)local_c8);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&temp.fUnion + 0x30));
  return;
}

Assistant:

void
NFRule::_appendRuleText(UnicodeString& result) const
{
    switch (getType()) {
    case kNegativeNumberRule: result.append(gMinusX, 2); break;
    case kImproperFractionRule: result.append(gX).append(decimalPoint == 0 ? gDot : decimalPoint).append(gX); break;
    case kProperFractionRule: result.append(gZero).append(decimalPoint == 0 ? gDot : decimalPoint).append(gX); break;
    case kMasterRule: result.append(gX).append(decimalPoint == 0 ? gDot : decimalPoint).append(gZero); break;
    case kInfinityRule: result.append(gInf, 3); break;
    case kNaNRule: result.append(gNaN, 3); break;
    default:
        // for a normal rule, write out its base value, and if the radix is
        // something other than 10, write out the radix (with the preceding
        // slash, of course).  Then calculate the expected exponent and if
        // if isn't the same as the actual exponent, write an appropriate
        // number of > signs.  Finally, terminate the whole thing with
        // a colon.
        util_append64(result, baseValue);
        if (radix != 10) {
            result.append(gSlash);
            util_append64(result, radix);
        }
        int numCarets = expectedExponent() - exponent;
        for (int i = 0; i < numCarets; i++) {
            result.append(gGreaterThan);
        }
        break;
    }
    result.append(gColon);
    result.append(gSpace);

    // if the rule text begins with a space, write an apostrophe
    // (whitespace after the rule descriptor is ignored; the
    // apostrophe is used to make the whitespace significant)
    if (fRuleText.charAt(0) == gSpace && (sub1 == NULL || sub1->getPos() != 0)) {
        result.append(gTick);
    }

    // now, write the rule's rule text, inserting appropriate
    // substitution tokens in the appropriate places
    UnicodeString ruleTextCopy;
    ruleTextCopy.setTo(fRuleText);

    UnicodeString temp;
    if (sub2 != NULL) {
        sub2->toString(temp);
        ruleTextCopy.insert(sub2->getPos(), temp);
    }
    if (sub1 != NULL) {
        sub1->toString(temp);
        ruleTextCopy.insert(sub1->getPos(), temp);
    }

    result.append(ruleTextCopy);

    // and finally, top the whole thing off with a semicolon and
    // return the result
    result.append(gSemicolon);
}